

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

float dvx(qnode_ptr_t p,int x,int y)

{
  int iVar1;
  beaudet_t *pbVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  iVar1 = Ix.m / 2;
  iVar3 = iVar1 * 3 + p->ofst;
  fVar7 = 0.0;
  if ((((iVar3 <= y) && (iVar3 <= x)) && (x < p->sizy - iVar3)) && (y < p->sizx - iVar3)) {
    iVar4 = -iVar1;
    lVar5 = (long)iVar4;
    iVar3 = iVar1 + 1;
    if (iVar1 + 1 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = x - iVar1;
    fVar7 = 0.0;
    pbVar2 = &Ix;
    for (; lVar5 != iVar3; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; (long)iVar1 * 2 + 1 != lVar6; lVar6 = lVar6 + 1) {
        fVar7 = fVar7 + (*p->flow_ptr)[p->res * iVar4 + (y - iVar1) + (int)lVar6].y *
                        pbVar2->g[0][lVar6];
      }
      iVar4 = iVar4 + 1;
      pbVar2 = (beaudet_t *)(pbVar2->g + 1);
    }
  }
  return fVar7 / Ix.f;
}

Assistant:

float dvx(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ extern beaudet_t Ix ;
  float d ;
  int i, j, h ;

  h = Ix.m/2 ;
  d = 0.0 ;

  if (!overflow(x,y,p->sizy,p->sizx,p->ofst,h,3)) {
    for (i = -h ; i <= h ; i++) {
      for (j = -h ; j <= h ; j++) {
        d = d + (*p->flow_ptr)[p->res*(x+i) + y+j].y*Ix.g[i+h][j+h] ;
      }
    }
  }
  return(d/Ix.f) ;
}